

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O1

bool __thiscall QAbstractSpinBox::event(QAbstractSpinBox *this,QEvent *event)

{
  ushort uVar1;
  QAbstractSpinBoxPrivate *this_00;
  char cVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined4 uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar9 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar10 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 0x61) {
    if (0x52 < uVar1) {
      if (uVar1 == 0x53) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          uVar4 = (**(code **)(*(long *)&this_00->edit->super_QWidget + 0x28))(this_00->edit,event);
          return (bool)uVar4;
        }
        goto LAB_00481491;
      }
      if (uVar1 == 0x5a) goto LAB_00481434;
      goto LAB_00481440;
    }
    if (uVar1 == 0x25) {
LAB_00481434:
      (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0x100))(this_00);
      goto LAB_00481440;
    }
    if (uVar1 != 0x33) goto LAB_00481440;
    cVar2 = (**(code **)(*(long *)&this_00->edit->super_QWidget + 0x28))(this_00->edit,event);
    bVar3 = true;
    if (cVar2 == '\0') goto LAB_00481440;
  }
  else {
    if (uVar1 - 0x7f < 3) {
      uVar5 = QEventPoint::position();
      auVar10._0_8_ =
           (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa;
      auVar10._8_8_ =
           (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa;
      auVar10 = minpd(_DAT_0066f5d0,auVar10);
      auVar9._8_8_ = -(ulong)(-2147483648.0 < auVar10._8_8_);
      auVar9._0_8_ = -(ulong)(-2147483648.0 < auVar10._0_8_);
      uVar6 = movmskpd(uVar5,auVar9);
      uVar8 = 0x8000000000000000;
      if ((uVar6 & 1) != 0) {
        uVar8 = (ulong)(uint)(int)auVar10._0_8_ << 0x20;
      }
      uVar7 = 0x80000000;
      if ((uVar6 & 2) != 0) {
        uVar7 = (ulong)(uint)(int)auVar10._8_8_;
      }
      local_28 = (QPoint)(uVar7 | uVar8);
      QAbstractSpinBoxPrivate::updateHoverControl(this_00,&local_28);
    }
    else if ((uVar1 == 100) || (uVar1 == 0x61)) {
      (this_00->cachedSizeHint).wd.m_i = -1;
      (this_00->cachedSizeHint).ht.m_i = -1;
      (this_00->cachedMinimumSizeHint).wd.m_i = -1;
      (this_00->cachedMinimumSizeHint).ht.m_i = -1;
    }
LAB_00481440:
    bVar3 = QWidget::event((QWidget *)this,event);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
LAB_00481491:
  __stack_chk_fail();
}

Assistant:

bool QAbstractSpinBox::event(QEvent *event)
{
    Q_D(QAbstractSpinBox);
    switch (event->type()) {
    case QEvent::FontChange:
    case QEvent::StyleChange:
        d->cachedSizeHint = d->cachedMinimumSizeHint = QSize();
        break;
    case QEvent::ApplicationLayoutDirectionChange:
    case QEvent::LayoutDirectionChange:
        d->updateEditFieldGeometry();
        break;
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        d->updateHoverControl(static_cast<const QHoverEvent *>(event)->position().toPoint());
        break;
    case QEvent::ShortcutOverride:
        if (d->edit->event(event))
            return true;
        break;
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
    case QEvent::LeaveEditFocus:
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            const bool b = d->edit->event(event);
            d->edit->setSelection(d->edit->displayText().size() - d->suffix.size(),0);
            if (event->type() == QEvent::LeaveEditFocus)
                emit editingFinished();
            if (b)
                return true;
        }
        break;
#endif
    case QEvent::InputMethod:
        return d->edit->event(event);
    default:
        break;
    }
    return QWidget::event(event);
}